

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_uv.cc
# Opt level: O0

void libyuv::ScaleUVDown4Box
               (int src_width,int src_height,int dst_width,int dst_height,int src_stride,
               int dst_stride,uint8_t *src_uv,uint8_t *dst_uv,int x,int dx,int y,int dy)

{
  uint uVar1;
  int iVar2;
  void *__ptr;
  ulong uVar3;
  int in_ECX;
  uint in_EDX;
  int in_R8D;
  int in_R9D;
  _func_void_uint8_t_ptr_ptrdiff_t_uint8_t_ptr_int *ScaleUVRowDown2;
  long in_stack_00000010;
  int row_stride;
  uint8_t *row;
  uint8_t *row_mem;
  int kRowSize;
  int j;
  code *pcVar4;
  int local_1c;
  
  uVar1 = in_EDX * 4 + 0xf & 0xfffffff0;
  __ptr = malloc((long)(int)(uVar1 * 2 + 0x3f));
  uVar3 = (long)__ptr + 0x3fU & 0xffffffffffffffc0;
  pcVar4 = ScaleUVRowDown2Box_C;
  ScaleUVRowDown2 = ScaleUVRowDown2 + ((kRowSize >> 0x10) * in_R8D + ((int)row >> 0x10) * 2);
  iVar2 = TestCpuFlag(0);
  if ((iVar2 != 0) && (pcVar4 = ScaleUVRowDown2Box_Any_SSSE3, (in_EDX & 3) == 0)) {
    pcVar4 = ScaleUVRowDown2Box_SSSE3;
  }
  iVar2 = TestCpuFlag(0);
  if ((iVar2 != 0) && (pcVar4 = ScaleUVRowDown2Box_Any_AVX2, (in_EDX & 7) == 0)) {
    pcVar4 = ScaleUVRowDown2Box_AVX2;
  }
  for (local_1c = 0; local_1c < in_ECX; local_1c = local_1c + 1) {
    (*pcVar4)(ScaleUVRowDown2,(long)in_R8D,uVar3,in_EDX << 1);
    (*pcVar4)(ScaleUVRowDown2 + (in_R8D << 1),(long)in_R8D,uVar3 + (long)(int)uVar1,in_EDX << 1);
    (*pcVar4)(uVar3,(long)(int)uVar1,in_stack_00000010,in_EDX);
    ScaleUVRowDown2 = ScaleUVRowDown2 + in_R8D * (dst_stride >> 0x10);
    in_stack_00000010 = in_stack_00000010 + in_R9D;
  }
  free(__ptr);
  return;
}

Assistant:

static void ScaleUVDown4Box(int src_width,
                            int src_height,
                            int dst_width,
                            int dst_height,
                            int src_stride,
                            int dst_stride,
                            const uint8_t* src_uv,
                            uint8_t* dst_uv,
                            int x,
                            int dx,
                            int y,
                            int dy) {
  int j;
  // Allocate 2 rows of UV.
  const int kRowSize = (dst_width * 2 * 2 + 15) & ~15;
  align_buffer_64(row, kRowSize * 2);
  int row_stride = src_stride * (dy >> 16);
  void (*ScaleUVRowDown2)(const uint8_t* src_uv, ptrdiff_t src_stride,
                          uint8_t* dst_uv, int dst_width) =
      ScaleUVRowDown2Box_C;
  // Advance to odd row, even column.
  src_uv += (y >> 16) * src_stride + (x >> 16) * 2;
  (void)src_width;
  (void)src_height;
  (void)dx;
  assert(dx == 65536 * 4);      // Test scale factor of 4.
  assert((dy & 0x3ffff) == 0);  // Test vertical scale is multiple of 4.

#if defined(HAS_SCALEUVROWDOWN2BOX_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    ScaleUVRowDown2 = ScaleUVRowDown2Box_Any_SSSE3;
    if (IS_ALIGNED(dst_width, 4)) {
      ScaleUVRowDown2 = ScaleUVRowDown2Box_SSSE3;
    }
  }
#endif
#if defined(HAS_SCALEUVROWDOWN2BOX_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    ScaleUVRowDown2 = ScaleUVRowDown2Box_Any_AVX2;
    if (IS_ALIGNED(dst_width, 8)) {
      ScaleUVRowDown2 = ScaleUVRowDown2Box_AVX2;
    }
  }
#endif
#if defined(HAS_SCALEUVROWDOWN2BOX_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    ScaleUVRowDown2 = ScaleUVRowDown2Box_Any_NEON;
    if (IS_ALIGNED(dst_width, 8)) {
      ScaleUVRowDown2 = ScaleUVRowDown2Box_NEON;
    }
  }
#endif

  for (j = 0; j < dst_height; ++j) {
    ScaleUVRowDown2(src_uv, src_stride, row, dst_width * 2);
    ScaleUVRowDown2(src_uv + src_stride * 2, src_stride, row + kRowSize,
                    dst_width * 2);
    ScaleUVRowDown2(row, kRowSize, dst_uv, dst_width);
    src_uv += row_stride;
    dst_uv += dst_stride;
  }
  free_aligned_buffer_64(row);
}